

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

ImportSourcePtr __thiscall libcellml::AnyCellmlElement::importSource(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::ImportSource> sVar1;
  ImportSourcePtr IVar2;
  
  if (*(int *)*in_RSI == 4) {
    sVar1 = std::any_cast<std::shared_ptr<libcellml::ImportSource>>((any *)this);
    in_RDX = sVar1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ImportSourcePtr)
         IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImportSourcePtr AnyCellmlElement::importSource() const
{
    if (mPimpl->mType == CellmlElementType::IMPORT) {
        try {
            return std::any_cast<ImportSourcePtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}